

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  key_type *pkVar1;
  Context *context;
  EnumDescriptor *pEVar2;
  pointer ppEVar3;
  EnumValueDescriptor *pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Descriptor *descriptor;
  size_t sVar5;
  bool bVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  long *plVar9;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  AlphaNum *a_04;
  char *pcVar10;
  ulong uVar11;
  int i_1;
  long lVar12;
  int i;
  long lVar13;
  Printer *this_00;
  undefined1 local_110 [8];
  string index_text;
  AlphaNum local_d0;
  char *local_a0;
  string local_98;
  undefined1 local_78 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  allocator local_32;
  char local_31;
  
  WriteEnumDocComment(printer,this->descriptor_);
  context = this->context_;
  pEVar2 = this->descriptor_;
  bVar6 = this->immutable_api_;
  std::__cxx11::string::string((string *)local_78,"",(allocator *)&local_d0);
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,printer,pEVar2,bVar6,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public enum $classname$\n    implements com.google.protobuf.ProtocolMessageEnum {\n",
             (char (*) [10])0x293a02,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              this->descriptor_);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>(printer,"classname",this->descriptor_);
  google::protobuf::io::Printer::Indent();
  std::__cxx11::string::string((string *)local_110,"ordinal()",(allocator *)local_78);
  ppEVar3 = (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3;
  uVar11 = 0xffffffffffffffff;
  do {
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
    if (uVar11 - uVar8 == -1) {
      local_31 = true;
      goto LAB_002233c6;
    }
    pEVar4 = ppEVar3[uVar11 + 1];
    uVar11 = uVar11 + 1;
  } while (uVar11 == (((long)pEVar4 - *(long *)(*(long *)(pEVar4 + 0x18) + 0x30)) / 0x28 &
                     0xffffffffU));
  std::__cxx11::string::assign(local_110);
  local_31 = uVar8 <= uVar11;
LAB_002233c6:
  local_a0 = "$name$($index$, $number$),\n";
  if ((bool)local_31 != false) {
    local_a0 = "$name$($number$),\n";
  }
  uVar11 = 0;
  pkVar1 = (key_type *)(index_text.field_2._M_local_buf + 8);
  while( true ) {
    sVar5 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if ((ulong)((long)(this->canonical_values_).
                      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->canonical_values_).
                      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar11) break;
    vars._M_t._M_impl._0_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::string((string *)&local_d0,"name",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    pEVar4 = (this->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11];
    strings::AlphaNum::AlphaNum
              (&local_d0,(int)(((long)pEVar4 - *(long *)(*(long *)(pEVar4 + 0x18) + 0x30)) / 0x28));
    StrCat_abi_cxx11_(&local_98,(protobuf *)&local_d0,a);
    std::__cxx11::string::string((string *)pkVar1,"index",&local_32);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,pkVar1);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_98);
    std::__cxx11::string::~string((string *)pkVar1);
    std::__cxx11::string::~string((string *)&local_98);
    strings::AlphaNum::AlphaNum
              (&local_d0,
               *(int *)((this->canonical_values_).
                        super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar11] + 0x10));
    StrCat_abi_cxx11_(&local_98,(protobuf *)&local_d0,a_00);
    std::__cxx11::string::string((string *)pkVar1,"number",&local_32);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,pkVar1);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_98);
    std::__cxx11::string::~string((string *)pkVar1);
    std::__cxx11::string::~string((string *)&local_98);
    WriteEnumValueDocComment
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (this->canonical_values_).
               super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]);
    if (*(char *)(*(long *)((this->canonical_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11] + 0x20) + 0x48) ==
        '\x01') {
      io::Printer::Print<>
                ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 "@java.lang.Deprecated\n");
    }
    google::protobuf::io::Printer::Print
              ((map *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,(char *)local_78);
    io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"name",
               (this->canonical_values_).
               super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_78);
    uVar11 = uVar11 + 1;
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 3) {
    pcVar10 = "${$UNRECOGNIZED$}$(-1, -1),\n";
    if (local_31 != '\0') {
      pcVar10 = "${$UNRECOGNIZED$}$(-1),\n";
    }
    io::Printer::Print<char[2],char[1],char[2],char[1]>
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,pcVar10,
               (char (*) [2])0x28bc66,(char (*) [1])0x285505,(char (*) [2])0x2bc6b7,
               (char (*) [1])0x285505);
    io::Printer::Annotate<google::protobuf::EnumDescriptor>
              ((Printer *)sVar5,"{","}",this->descriptor_);
  }
  io::Printer::Print<>((Printer *)sVar5,";\n\n");
  lVar12 = 0;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(this->aliases_).
                             super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->aliases_).
                             super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); uVar11 = uVar11 + 1) {
    vars._M_t._M_impl._0_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::string((string *)&local_d0,"classname",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"name",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"canonical_name",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    sVar5 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    WriteEnumValueDocComment
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               *(EnumValueDescriptor **)
                ((long)&((this->aliases_).
                         super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                         ._M_impl.super__Vector_impl_data._M_start)->value + lVar12));
    google::protobuf::io::Printer::Print((map *)sVar5,local_78);
    io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
              ((Printer *)sVar5,"name",
               *(EnumValueDescriptor **)
                ((long)&((this->aliases_).
                         super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                         ._M_impl.super__Vector_impl_data._M_start)->value + lVar12));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_78);
    lVar12 = lVar12 + 0x10;
  }
  lVar13 = 0;
  local_a0 = "}";
  for (lVar12 = 0; sVar5 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
      lVar12 < *(int *)(this->descriptor_ + 0x2c); lVar12 = lVar12 + 1) {
    vars._M_t._M_impl._0_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::string((string *)&local_d0,"name",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    strings::AlphaNum::AlphaNum
              (&local_d0,*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar13));
    StrCat_abi_cxx11_(&local_98,(protobuf *)&local_d0,a_01);
    pkVar1 = (key_type *)(index_text.field_2._M_local_buf + 8);
    std::__cxx11::string::string((string *)pkVar1,"number",&local_32);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,pkVar1);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_98);
    std::__cxx11::string::~string((string *)pkVar1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_d0,"{",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"}",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"deprecation",(allocator *)&local_98);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78,(key_type *)&local_d0);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    sVar5 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    WriteEnumValueDocComment
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (EnumValueDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar13));
    google::protobuf::io::Printer::Print((map *)sVar5,local_78);
    io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
              ((Printer *)sVar5,"{","}",
               (EnumValueDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar13));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_78);
    lVar13 = lVar13 + 0x28;
  }
  io::Printer::Print<>((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n");
  io::Printer::Print<>((Printer *)sVar5,"\npublic final int getNumber() {\n");
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 3) {
    pcVar10 = 
    "  if (index == -1) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
    ;
    if (local_31 != '\0') {
      pcVar10 = 
      "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
      ;
    }
    io::Printer::Print<>((Printer *)sVar5,pcVar10);
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)sVar5,
             "  return value;\n}\n\n/**\n * @param value The numeric wire value of the corresponding enum entry.\n * @return The enum associated with the given numeric wire value.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\n/**\n * @param value The numeric wire value of the corresponding enum entry.\n * @return The enum associated with the given numeric wire value.\n */\npublic static $classname$ forNumber(int value) {\n  switch (value) {\n"
             ,(char (*) [10])0x293a02,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              this->descriptor_);
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Indent();
  for (uVar11 = 0; this_00 = (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
      ppEVar3 = (this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->canonical_values_).
                             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3);
      uVar11 = uVar11 + 1) {
    pEVar4 = ppEVar3[uVar11];
    args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pEVar4;
    strings::AlphaNum::AlphaNum((AlphaNum *)local_78,*(int *)(pEVar4 + 0x10));
    StrCat_abi_cxx11_((string *)&local_d0,(protobuf *)local_78,a_02);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "case $number$: return $name$;\n",(char (*) [5])0x2d29e2,args_1,
               (char (*) [7])0x2b3515,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<char[10],std::__cxx11::string>
            (this_00,
             "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\n"
             ,(char (*) [10])0x293a02,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              this->descriptor_);
  if ((this->context_->options_).enforce_lite == false) {
    io::Printer::Print<>
              (this_00,
               "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n    getValueDescriptor() {\n"
              );
    if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 3) {
      pcVar10 = 
      "  if (index == -1) {\n    throw new java.lang.IllegalStateException(\n        \"Can\'t get the descriptor of an unrecognized enum value.\");\n  }\n"
      ;
      if (local_31 != '\0') {
        pcVar10 = 
        "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalStateException(\n        \"Can\'t get the descriptor of an unrecognized enum value.\");\n  }\n"
        ;
      }
      io::Printer::Print<>(this_00,pcVar10);
    }
    io::Printer::Print<char[11],std::__cxx11::string>
              (this_00,
               "  return getDescriptor().getValues().get($index_text$);\n}\npublic final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\npublic static final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptor() {\n"
               ,(char (*) [11])"index_text",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    descriptor = *(Descriptor **)(this->descriptor_ + 0x18);
    if (descriptor == (Descriptor *)0x0) {
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)&local_d0,this->name_resolver_,
                 *(FileDescriptor **)(this->descriptor_ + 0x10),this->immutable_api_);
      pEVar2 = this->descriptor_;
      plVar9 = (long *)(*(long *)(pEVar2 + 0x10) + 0x70);
      if (*(long *)(pEVar2 + 0x18) != 0) {
        plVar9 = (long *)(*(long *)(pEVar2 + 0x18) + 0x40);
      }
      strings::AlphaNum::AlphaNum((AlphaNum *)local_78,(int)(((long)pEVar2 - *plVar9) / 0x50));
      StrCat_abi_cxx11_(&local_98,(protobuf *)local_78,a_04);
      io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
                (this_00,"  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
                 (char (*) [5])0x2c8b50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                 (char (*) [6])0x28ffdd,&local_98);
    }
    else {
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)&local_d0,this->name_resolver_,descriptor,this->immutable_api_);
      pEVar2 = this->descriptor_;
      lVar12 = *(long *)(pEVar2 + 0x18);
      pcVar10 = "getDescriptor()";
      if (*(char *)(*(long *)(lVar12 + 0x20) + 0x49) != '\0') {
        pcVar10 = "getDefaultInstance().getDescriptorForType()";
      }
      plVar9 = (long *)(*(long *)(pEVar2 + 0x10) + 0x70);
      if (lVar12 != 0) {
        plVar9 = (long *)(lVar12 + 0x40);
      }
      index_text.field_2._8_8_ = pcVar10;
      strings::AlphaNum::AlphaNum((AlphaNum *)local_78,(int)(((long)pEVar2 - *plVar9) / 0x50));
      StrCat_abi_cxx11_(&local_98,(protobuf *)local_78,a_03);
      io::Printer::
      Print<char[7],std::__cxx11::string,char[11],char_const*,char[6],std::__cxx11::string>
                (this_00,"  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
                 (char (*) [7])"parent",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                 (char (*) [11])0x2ac6d8,(char **)((long)&index_text.field_2 + 8),
                 (char (*) [6])0x28ffdd,&local_98);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d0);
    io::Printer::Print<char[10],std::__cxx11::string>
              (this_00,"}\n\nprivate static final $classname$[] VALUES = ",(char (*) [10])0x293a02,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                this->descriptor_);
    bVar6 = CanUseEnumValues(this);
    if (bVar6) {
      local_a0 = "values();\n";
    }
    else {
      io::Printer::Print<>(this_00,"getStaticValuesArray();\n");
      io::Printer::Print<char[10],std::__cxx11::string>
                (this_00,"private static $classname$[] getStaticValuesArray() {\n",
                 (char (*) [10])0x293a02,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  this->descriptor_);
      google::protobuf::io::Printer::Indent();
      io::Printer::Print<char[10],std::__cxx11::string>
                (this_00,"return new $classname$[] {\n  ",(char (*) [10])0x293a02,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  this->descriptor_);
      lVar12 = 0;
      for (lVar13 = 0; this_00 = (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
          lVar13 < *(int *)(this->descriptor_ + 0x2c); lVar13 = lVar13 + 1) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"$name$, ",
                   (char (*) [5])0x2d29e2,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(this->descriptor_ + 0x30) + lVar12));
        lVar12 = lVar12 + 0x28;
      }
      io::Printer::Print<>
                ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n};\n");
      google::protobuf::io::Printer::Outdent();
    }
    io::Printer::Print<>(this_00,local_a0);
    io::Printer::Print<char[10],std::__cxx11::string>
              (this_00,
               "\npublic static $classname$ valueOf(\n    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n  if (desc.getType() != getDescriptor()) {\n    throw new java.lang.IllegalArgumentException(\n      \"EnumValueDescriptor is not for this type.\");\n  }\n"
               ,(char (*) [10])0x293a02,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                this->descriptor_);
    if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 3) {
      io::Printer::Print<>
                (this_00,"  if (desc.getIndex() == -1) {\n    return UNRECOGNIZED;\n  }\n");
    }
    io::Printer::Print<>(this_00,"  return VALUES[desc.getIndex()];\n}\n\n");
    if (local_31 == '\0') {
      io::Printer::Print<>(this_00,"private final int index;\n");
    }
  }
  io::Printer::Print<>(this_00,"private final int value;\n\n");
  if (local_31 == '\0') {
    io::Printer::Print<char[10],std::__cxx11::string>
              (this_00,"private $classname$(int index, int value) {\n",(char (*) [10])0x293a02,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                this->descriptor_);
    if (local_31 == '\0' && (this->context_->options_).enforce_lite == false) {
      io::Printer::Print<>(this_00,"  this.index = index;\n");
    }
  }
  else {
    io::Printer::Print<char[10],std::__cxx11::string>
              (this_00,"private $classname$(int value) {\n",(char (*) [10])0x293a02,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                this->descriptor_);
  }
  io::Printer::Print<>(this_00,"  this.value = value;\n}\n");
  io::Printer::Print<char[10],std::__cxx11::string>
            (this_00,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n",
             (char (*) [10])0x2922f7,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->descriptor_ + 8));
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(this_00,"}\n\n");
  std::__cxx11::string::~string((string *)local_110);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);
  printer->Print(
      "public enum $classname$\n"
      "    implements com.google.protobuf.ProtocolMessageEnum {\n",
      "classname", descriptor_->name());
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  bool ordinal_is_index = true;
  std::string index_text = "ordinal()";
  for (int i = 0; i < canonical_values_.size(); i++) {
    if (canonical_values_[i]->index() != i) {
      ordinal_is_index = false;
      index_text = "index";
      break;
    }
  }

  for (int i = 0; i < canonical_values_.size(); i++) {
    std::map<std::string, std::string> vars;
    vars["name"] = canonical_values_[i]->name();
    vars["index"] = StrCat(canonical_values_[i]->index());
    vars["number"] = StrCat(canonical_values_[i]->number());
    WriteEnumValueDocComment(printer, canonical_values_[i]);
    if (canonical_values_[i]->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    if (ordinal_is_index) {
      printer->Print(vars, "$name$($number$),\n");
    } else {
      printer->Print(vars, "$name$($index$, $number$),\n");
    }
    printer->Annotate("name", canonical_values_[i]);
  }

  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print("${$UNRECOGNIZED$}$(-1),\n", "{", "", "}", "");
    } else {
      printer->Print("${$UNRECOGNIZED$}$(-1, -1),\n", "{", "", "}", "");
    }
    printer->Annotate("{", "}", descriptor_);
  }

  printer->Print(
      ";\n"
      "\n");

  // -----------------------------------------------------------------

  for (int i = 0; i < aliases_.size(); i++) {
    std::map<std::string, std::string> vars;
    vars["classname"] = descriptor_->name();
    vars["name"] = aliases_[i].value->name();
    vars["canonical_name"] = aliases_[i].canonical_value->name();
    WriteEnumValueDocComment(printer, aliases_[i].value);
    printer->Print(
        vars, "public static final $classname$ $name$ = $canonical_name$;\n");
    printer->Annotate("name", aliases_[i].value);
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    std::map<std::string, std::string> vars;
    vars["name"] = descriptor_->value(i)->name();
    vars["number"] = StrCat(descriptor_->value(i)->number());
    vars["{"] = "";
    vars["}"] = "";
    vars["deprecation"] = descriptor_->value(i)->options().deprecated()
                              ? "@java.lang.Deprecated "
                              : "";
    WriteEnumValueDocComment(printer, descriptor_->value(i));
    printer->Print(vars,
                   "$deprecation$public static final int ${$$name$_VALUE$}$ = "
                   "$number$;\n");
    printer->Annotate("{", "}", descriptor_->value(i));
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
      "\n"
      "public final int getNumber() {\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print(
          "  if (this == UNRECOGNIZED) {\n"
          "    throw new java.lang.IllegalArgumentException(\n"
          "        \"Can't get the number of an unknown enum value.\");\n"
          "  }\n");
    } else {
      printer->Print(
          "  if (index == -1) {\n"
          "    throw new java.lang.IllegalArgumentException(\n"
          "        \"Can't get the number of an unknown enum value.\");\n"
          "  }\n");
    }
  }
  printer->Print(
      "  return value;\n"
      "}\n"
      "\n"
      "/**\n"
      " * @param value The numeric wire value of the corresponding enum "
      "entry.\n"
      " * @return The enum associated with the given numeric wire value.\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $classname$ valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "/**\n"
      " * @param value The numeric wire value of the corresponding enum "
      "entry.\n"
      " * @return The enum associated with the given numeric wire value.\n"
      " */\n"
      "public static $classname$ forNumber(int value) {\n"
      "  switch (value) {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print("case $number$: return $name$;\n", "name",
                   canonical_values_[i]->name(), "number",
                   StrCat(canonical_values_[i]->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
      "    internalGetValueMap() {\n"
      "  return internalValueMap;\n"
      "}\n"
      "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
      "    $classname$> internalValueMap =\n"
      "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
      "        public $classname$ findValueByNumber(int number) {\n"
      "          return $classname$.forNumber(number);\n"
      "        }\n"
      "      };\n"
      "\n",
      "classname", descriptor_->name());

  // -----------------------------------------------------------------
  // Reflection

  if (HasDescriptorMethods(descriptor_, context_->EnforceLite())) {
    printer->Print(
        "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n"
        "    getValueDescriptor() {\n");
    if (SupportUnknownEnumValue(descriptor_->file())) {
      if (ordinal_is_index) {
        printer->Print(
            "  if (this == UNRECOGNIZED) {\n"
            "    throw new java.lang.IllegalStateException(\n"
            "        \"Can't get the descriptor of an unrecognized enum "
            "value.\");\n"
            "  }\n");
      } else {
        printer->Print(
            "  if (index == -1) {\n"
            "    throw new java.lang.IllegalStateException(\n"
            "        \"Can't get the descriptor of an unrecognized enum "
            "value.\");\n"
            "  }\n");
      }
    }
    printer->Print(
        "  return getDescriptor().getValues().get($index_text$);\n"
        "}\n"
        "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
        "    getDescriptorForType() {\n"
        "  return getDescriptor();\n"
        "}\n"
        "public static final com.google.protobuf.Descriptors.EnumDescriptor\n"
        "    getDescriptor() {\n",
        "index_text", index_text);

    // TODO(kenton):  Cache statically?  Note that we can't access descriptors
    //   at module init time because it wouldn't work with descriptor.proto, but
    //   we can cache the value the first time getDescriptor() is called.
    if (descriptor_->containing_type() == NULL) {
      // The class generated for the File fully populates the descriptor with
      // extensions in both the mutable and immutable cases. (In the mutable api
      // this is accomplished by attempting to load the immutable outer class).
      printer->Print(
          "  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
          "file",
          name_resolver_->GetClassName(descriptor_->file(), immutable_api_),
          "index", StrCat(descriptor_->index()));
    } else {
      printer->Print(
          "  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
          "parent",
          name_resolver_->GetClassName(descriptor_->containing_type(),
                                       immutable_api_),
          "descriptor",
          descriptor_->containing_type()
                  ->options()
                  .no_standard_descriptor_accessor()
              ? "getDefaultInstance().getDescriptorForType()"
              : "getDescriptor()",
          "index", StrCat(descriptor_->index()));
    }

    printer->Print(
        "}\n"
        "\n"
        "private static final $classname$[] VALUES = ",
        "classname", descriptor_->name());

    if (CanUseEnumValues()) {
      // If the constants we are going to output are exactly the ones we
      // have declared in the Java enum in the same order, then we can use
      // the values() method that the Java compiler automatically generates
      // for every enum.
      printer->Print("values();\n");
    } else {
      printer->Print("getStaticValuesArray();\n");
      printer->Print("private static $classname$[] getStaticValuesArray() {\n",
                     "classname", descriptor_->name());
      printer->Indent();
      printer->Print(
          "return new $classname$[] {\n"
          "  ",
          "classname", descriptor_->name());
      for (int i = 0; i < descriptor_->value_count(); i++) {
        printer->Print("$name$, ", "name", descriptor_->value(i)->name());
      }
      printer->Print(
          "\n"
          "};\n");
      printer->Outdent();
      printer->Print("}");
    }

    printer->Print(
        "\n"
        "public static $classname$ valueOf(\n"
        "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n"
        "  if (desc.getType() != getDescriptor()) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "      \"EnumValueDescriptor is not for this type.\");\n"
        "  }\n",
        "classname", descriptor_->name());
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
          "  if (desc.getIndex() == -1) {\n"
          "    return UNRECOGNIZED;\n"
          "  }\n");
    }
    printer->Print(
        "  return VALUES[desc.getIndex()];\n"
        "}\n"
        "\n");

    if (!ordinal_is_index) {
      printer->Print("private final int index;\n");
    }
  }

  // -----------------------------------------------------------------

  printer->Print("private final int value;\n\n");

  if (ordinal_is_index) {
    printer->Print("private $classname$(int value) {\n", "classname",
                   descriptor_->name());
  } else {
    printer->Print("private $classname$(int index, int value) {\n", "classname",
                   descriptor_->name());
  }
  if (HasDescriptorMethods(descriptor_, context_->EnforceLite()) &&
      !ordinal_is_index) {
    printer->Print("  this.index = index;\n");
  }
  printer->Print(
      "  this.value = value;\n"
      "}\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}